

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cpp
# Opt level: O0

int PVSearch(Situation *situation,int depth,int alpha,int beta,Movement *inspire)

{
  Movement move_00;
  Movement move_01;
  Movement move_02;
  Movement move_03;
  Movement hash_move;
  bool bVar1;
  clock_t cVar2;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  undefined8 *in_R8;
  int i;
  int move_num;
  bool PVflag;
  bool isAlpha;
  Movement inspire_move;
  Movement good_move;
  Movement move;
  Movement move_list [128];
  int best;
  int value;
  int in_stack_fffffffffffff908;
  int in_stack_fffffffffffff90c;
  undefined4 in_stack_fffffffffffff910;
  undefined4 in_stack_fffffffffffff914;
  undefined4 in_stack_fffffffffffff940;
  undefined4 in_stack_fffffffffffff944;
  undefined4 in_stack_fffffffffffff94c;
  undefined4 in_stack_fffffffffffff950;
  undefined4 in_stack_fffffffffffff954;
  undefined4 in_stack_fffffffffffff958;
  undefined4 in_stack_fffffffffffff95c;
  undefined4 in_stack_fffffffffffff960;
  int iVar3;
  undefined4 uVar4;
  int iVar5;
  ushort in_stack_fffffffffffff984;
  byte bVar6;
  byte bVar7;
  int *in_stack_fffffffffffff988;
  int in_stack_fffffffffffff990;
  undefined4 in_stack_fffffffffffff994;
  int *piVar8;
  int local_648;
  undefined8 local_644;
  int local_63c;
  undefined8 local_638;
  int aiStack_630 [152];
  int in_stack_fffffffffffffc30;
  int in_stack_fffffffffffffc34;
  Situation *in_stack_fffffffffffffc38;
  undefined1 in_stack_ffffffffffffff9f;
  int in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  Situation *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffd0;
  int value_00;
  int in_stack_ffffffffffffffe0;
  int local_4;
  
  iVar3._0_1_ = '\0';
  iVar3._1_1_ = '\0';
  iVar3._2_2_ = 0;
  piVar8 = (int *)0;
  local_648._0_1_ = '\0';
  local_648._1_1_ = '\0';
  local_648._2_2_ = 0;
  local_644 = (int *)0;
  local_63c._0_1_ = '\0';
  local_63c._1_1_ = '\0';
  local_63c._2_2_ = 0;
  if (in_ESI < 1) {
    local_4 = QuiescentSearch(in_stack_fffffffffffffc38,in_stack_fffffffffffffc34,
                              in_stack_fffffffffffffc30);
  }
  else {
    local_4 = in_ECX;
    if ((step + -10000 < in_ECX) &&
       ((local_4 = ReadHashTable(in_ESI,in_EDX,in_ECX,(Movement *)&local_644), local_4 == 0x100000
        || (local_4 < -9999)))) {
      if ((2 < in_ESI) &&
         (move_03.value = in_stack_fffffffffffff95c, move_03.from = (char)in_stack_fffffffffffff958,
         move_03.to = (char)((uint)in_stack_fffffffffffff958 >> 8),
         move_03.capture = (char)((uint)in_stack_fffffffffffff958 >> 0x10),
         move_03._3_1_ = (char)((uint)in_stack_fffffffffffff958 >> 0x18),
         move_03.catc = (char)in_stack_fffffffffffff960,
         move_03.movec = (char)((uint)in_stack_fffffffffffff960 >> 8),
         move_03._10_2_ = (short)((uint)in_stack_fffffffffffff960 >> 0x10),
         in_stack_fffffffffffff988 = local_644, in_stack_fffffffffffff990 = local_63c,
         bVar1 = MovementsLegal(move_03,(Situation *)
                                        CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940
                                                )), !bVar1)) {
        local_4 = PVSearch((Situation *)CONCAT44(in_ESI,in_EDX),in_ECX,in_stack_ffffffffffffffe0,
                           (int)((ulong)in_R8 >> 0x20),
                           (Movement *)CONCAT44(local_4,in_stack_ffffffffffffffd0));
        if (local_4 <= in_EDX) {
          local_4 = PVSearch((Situation *)CONCAT44(in_ESI,in_EDX),in_ECX,in_stack_ffffffffffffffe0,
                             (int)((ulong)in_R8 >> 0x20),
                             (Movement *)CONCAT44(local_4,in_stack_ffffffffffffffd0));
        }
        local_644 = (int *)0;
        local_63c = iVar3;
      }
      if (((isTimeLimit & 1U) == 0) && (cVar2 = clock(), cVar2 - StartTime < 0x9c41)) {
        value_00 = -0x100000;
        bVar7 = 1;
        bVar6 = 0;
        iVar5 = 0;
        uVar4 = SUB84(local_644,0);
        hash_move._4_8_ = piVar8;
        hash_move.from = (char)iVar3;
        hash_move.to = (char)((uint)iVar3 >> 8);
        hash_move.capture = (char)((uint)iVar3 >> 0x10);
        hash_move._3_1_ = (char)((uint)iVar3 >> 0x18);
        MoveSort((Situation *)CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990),
                 in_stack_fffffffffffff988,
                 (Movement *)CONCAT17(1,(uint7)in_stack_fffffffffffff984 << 0x20),hash_move,
                 local_63c);
        for (iVar3 = 0; iVar3 < iVar5; iVar3 = iVar3 + 1) {
          local_644 = *(int **)((long)&local_638 + (long)iVar3 * 0xc);
          local_63c = aiStack_630[(long)iVar3 * 3];
          if (((UINT8)local_644 != '\0') ||
             (local_644._1_1_ = (UINT8)((ulong)local_644 >> 8), bVar1 = local_644._1_1_ != '\0',
             bVar1)) {
            bVar1 = MakeAMove((Situation *)
                              CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958),
                              (Movement *)
                              CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950),
                              SUB41((uint)in_stack_fffffffffffff94c >> 0x18,0));
            if (bVar1) {
              local_4 = step + -10000;
            }
            else if ((bVar6 & 1) == 0) {
              local_4 = PVSearch((Situation *)CONCAT44(in_ESI,in_EDX),in_ECX,
                                 in_stack_ffffffffffffffe0,(int)((ulong)in_R8 >> 0x20),
                                 (Movement *)CONCAT44(local_4,value_00));
              local_4 = -local_4;
            }
            else {
              local_4 = SearchCut(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,
                                  in_stack_ffffffffffffffa0,(bool)in_stack_ffffffffffffff9f);
              local_4 = -local_4;
              if ((in_EDX < local_4) && (local_4 < in_ECX)) {
                local_4 = PVSearch((Situation *)CONCAT44(in_ESI,in_EDX),in_ECX,
                                   in_stack_ffffffffffffffe0,(int)((ulong)in_R8 >> 0x20),
                                   (Movement *)CONCAT44(local_4,value_00));
                local_4 = -local_4;
              }
            }
            UnMakeAMove((Situation *)CONCAT44(uVar4,iVar3));
            if (in_ECX <= local_4) {
              SetBestMove((Movement *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910),
                          in_stack_fffffffffffff90c,in_stack_fffffffffffff908);
              move_02.catc = (undefined1)local_63c;
              move_02.movec = local_63c._1_1_;
              move_02._10_2_ = local_63c._2_2_;
              move_02._0_8_ = local_644;
              SaveHashTable(in_ESI,in_ECX,'\x02',move_02);
              return in_ECX;
            }
            if (value_00 < local_4) {
              local_648 = local_63c;
              *in_R8 = local_644;
              *(int *)(in_R8 + 1) = local_63c;
              piVar8 = local_644;
              value_00 = local_4;
              if (in_EDX < local_4) {
                bVar7 = 0;
                bVar6 = 1;
                in_EDX = local_4;
              }
            }
          }
        }
        if ((bVar7 & 1) == 0) {
          SetBestMove((Movement *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910),
                      in_stack_fffffffffffff90c,in_stack_fffffffffffff908);
          move_00.catc = (undefined1)local_648;
          move_00.movec = local_648._1_1_;
          move_00._10_2_ = local_648._2_2_;
          move_00._0_8_ = piVar8;
          SaveHashTable(in_ESI,value_00,'\0',move_00);
          local_4 = in_EDX;
        }
        else {
          move_01.catc = (undefined1)local_648;
          move_01.movec = local_648._1_1_;
          move_01._10_2_ = local_648._2_2_;
          move_01._0_8_ = piVar8;
          SaveHashTable(in_ESI,in_EDX,'\x01',move_01);
          local_4 = in_EDX;
        }
      }
      else {
        isTimeLimit = true;
        local_4 = 0x100000;
      }
    }
  }
  return local_4;
}

Assistant:

int PVSearch(Situation& situation, int depth, int alpha, int beta, Movement& inspire){
    int value;                      // 下一着法的分值
    int best;                       // 所有着法中的最佳分值
    Movement move_list[128];        // 当前所有着法
    Movement move;                  // 当前着法
    Movement good_move;             // 当前局面最佳着法
    Movement inspire_move;          // 内部迭代启发着法
    move = good_move = inspire_move = NONE_MOVE;

    // 到达搜索深度
    if(depth <= 0){
        // 静态搜索评估
        return QuiescentSearch(situation, alpha, beta);
    }

    if(step - MAX_VALUE >= beta)
        return beta;

    // 置换表裁剪
    value = ReadHashTable(depth, alpha, beta, move);
    if(value != NONE_VALUE && value > -MAX_VALUE){
        return value;
    }

    // 内部迭代加深启发(在置换表未能给出启发走法时使用)
    if(depth > 2 && !MovementsLegal(move, situation)){
        value = PVSearch(situation, depth / 2, alpha, beta, inspire_move);
        if(value <= alpha){
            value = PVSearch(situation, depth / 2, -NONE_VALUE, beta, inspire_move);
        }
        move = inspire_move;
    }

    // 时间检测，避免超限
    if(isTimeLimit || clock() - StartTime > MAX_TIME){
        isTimeLimit = 1;
        return NONE_VALUE;
    }
    
    best = -NONE_VALUE;
    bool isAlpha = true;    // 当前结点是否为Alpha结点
    bool PVflag = false;

    int move_num = 0;       // 着法数量
    // 生成着法
    MoveSort(situation, move_num, move_list, move, step);
    for(int i = 0; i < move_num; i++){
        move = move_list[i];
        if(move.from == 0 && move.to == 0) continue;
        // 下子
        if(MakeAMove(situation, move)){
            value = -MAX_VALUE + step;
        }
        else{
            if(PVflag){
                value = -SearchCut(situation, depth - 1, -alpha);
                if(value > alpha && value < beta)
                    value = -PVSearch(situation, depth - 1, -beta, -alpha, inspire_move);
            }
            else
                value = -PVSearch(situation, depth - 1, -beta, -alpha, inspire_move);
        }
        // 回溯
        UnMakeAMove(situation);

        // 当前为beta结点，执行剪枝
        if(value >= beta){
            // inspire = move;
            // 此着法是好着法，记录进历史表和杀手表
            SetBestMove(move, step, depth);
            SaveHashTable(depth, beta, hashBETA, move);
            return beta;
        }
        if(value > best){
            best = value;           // 更新最佳分数
            good_move = move;       // 更新最佳着法
            inspire = good_move;
            if(value > alpha){
                isAlpha = false;
                PVflag = true;
                alpha = value;
            }
        }
    }

    // 当前结点为alpha结点
    if(isAlpha){
        SaveHashTable(depth, alpha, hashALPHA, good_move);
    }
    // 当前结点为PV结点
    else{
        // 将PV结点中的最好着法，记录进历史表和杀手表
        SetBestMove(good_move, step, depth);
        SaveHashTable(depth, best, hashEXACT, good_move);
    }
    return alpha;
}